

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O0

pair<int,_unsigned_short> __thiscall
n_e_s::core::Mapper2::translate_nametable_addr(Mapper2 *this,uint16_t addr,Mirroring m)

{
  Mirroring MVar1;
  INesHeader *this_00;
  runtime_error *this_01;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  uint local_60 [3];
  int local_54;
  uint local_50 [3];
  int local_44;
  uint local_40 [3];
  int local_34;
  uint local_30 [3];
  int local_24;
  Mirroring local_20;
  ushort local_1a;
  Mirroring m_local;
  uint16_t addr_local;
  Mapper2 *this_local;
  
  local_1a = addr & 0xfff;
  local_20 = m;
  _m_local = this;
  if (m == Horizontal) {
    if (local_1a < 0x400) {
      local_24 = 0;
      local_30[2] = (uint)local_1a % 0x400;
      std::pair<int,_unsigned_short>::pair<int,_int,_true>
                ((pair<int,_unsigned_short> *)&this_local,&local_24,(int *)(local_30 + 2));
    }
    else if ((local_1a < 0x400) || (0x7ff < local_1a)) {
      if ((local_1a < 0x800) || (0xbff < local_1a)) {
        if ((local_1a < 0xc00) || (0xfff < local_1a)) goto LAB_0014577b;
        local_40[1] = 1;
        local_40[0] = (uint)local_1a % 0x400;
        std::pair<int,_unsigned_short>::pair<int,_int,_true>
                  ((pair<int,_unsigned_short> *)&this_local,(int *)(local_40 + 1),(int *)local_40);
      }
      else {
        local_34 = 1;
        local_40[2] = (uint)local_1a % 0x400;
        std::pair<int,_unsigned_short>::pair<int,_int,_true>
                  ((pair<int,_unsigned_short> *)&this_local,&local_34,(int *)(local_40 + 2));
      }
    }
    else {
      local_30[1] = 0;
      local_30[0] = (uint)local_1a % 0x400;
      std::pair<int,_unsigned_short>::pair<int,_int,_true>
                ((pair<int,_unsigned_short> *)&this_local,(int *)(local_30 + 1),(int *)local_30);
    }
  }
  else {
    this_00 = IRom::header(&this->super_IRom);
    MVar1 = INesHeader::mirroring(this_00);
    if (MVar1 != Vertical) {
LAB_0014577b:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_a0,(uint)local_1a);
      std::operator+(&local_80,"Unknown address: ",&local_a0);
      std::runtime_error::runtime_error(this_01,(string *)&local_80);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_1a < 0x400) {
      local_44 = 0;
      local_50[2] = (uint)local_1a % 0x400;
      std::pair<int,_unsigned_short>::pair<int,_int,_true>
                ((pair<int,_unsigned_short> *)&this_local,&local_44,(int *)(local_50 + 2));
    }
    else if ((local_1a < 0x400) || (0x7ff < local_1a)) {
      if ((local_1a < 0x800) || (0xbff < local_1a)) {
        if ((local_1a < 0xc00) || (0xfff < local_1a)) goto LAB_0014577b;
        local_60[1] = 1;
        local_60[0] = (uint)local_1a % 0x400;
        std::pair<int,_unsigned_short>::pair<int,_int,_true>
                  ((pair<int,_unsigned_short> *)&this_local,(int *)(local_60 + 1),(int *)local_60);
      }
      else {
        local_54 = 0;
        local_60[2] = (uint)local_1a % 0x400;
        std::pair<int,_unsigned_short>::pair<int,_int,_true>
                  ((pair<int,_unsigned_short> *)&this_local,&local_54,(int *)(local_60 + 2));
      }
    }
    else {
      local_50[1] = 1;
      local_50[0] = (uint)local_1a % 0x400;
      std::pair<int,_unsigned_short>::pair<int,_int,_true>
                ((pair<int,_unsigned_short> *)&this_local,(int *)(local_50 + 1),(int *)local_50);
    }
  }
  return (pair<int,_unsigned_short>)this_local;
}

Assistant:

std::pair<int, uint16_t> Mapper2::translate_nametable_addr(uint16_t addr,
        Mirroring m) const {
    // TODO(johnor): This logic is identical to mapper 0 (Nrom).
    // Refactor and move outside the mapper.

    // Nametables
    // Range        Size    Desc
    // $2000-$23FF  $0400   Nametable 0
    // $2400-$27FF  $0400   Nametable 1
    // $2800-$2BFF  $0400   Nametable 2
    // $2C00-$2FFF  $0400   Nametable 3
    // $3000-$3EFF  $0F00   Mirrors of $2000-$2EFF

    // Ignore top 4 bits to handle mirroring
    addr &= 0x0FFFu;
    if (m == Mirroring::Horizontal) {
        // Nametable 0 and 1 should be the same
        if (addr <= 0x03FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0400 && addr <= 0x07FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0800 && addr <= 0x0BFF) {
            return {1, addr % 0x0400};
        }
        if (addr >= 0x0C00 && addr <= 0x0FFF) {
            return {1, addr % 0x0400};
        }
    } else if (header().mirroring() == Mirroring::Vertical) {
        // Nametable 0 and 3 should be the same
        if (addr <= 0x03FF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0400 && addr <= 0x07FF) {
            return {1, addr % 0x0400};
        }
        if (addr >= 0x0800 && addr <= 0x0BFF) {
            return {0, addr % 0x0400};
        }
        if (addr >= 0x0C00 && addr <= 0x0FFF) {
            return {1, addr % 0x0400};
        }
    }
    throw std::runtime_error("Unknown address: " + std::to_string(addr));
}